

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Vec_Ptr_t * Aig_ManDfsReverse(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  long lVar4;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  long lVar8;
  
  Aig_ManIncrementTravId(p);
  lVar4 = (long)p->vCos->nSize;
  if (0 < lVar4) {
    ppvVar5 = p->vCos->pArray;
    iVar1 = p->nTravIds;
    lVar8 = 0;
    do {
      *(int *)((long)ppvVar5[lVar8] + 0x20) = iVar1;
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  iVar1 = p->nObjs[5];
  iVar2 = p->nObjs[6];
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < (iVar2 + iVar1) - 1U) {
    iVar7 = iVar2 + iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  vNodes->pArray = ppvVar5;
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar6->pArray[lVar4];
      if ((pObj != (Aig_Obj_t *)0x0) &&
         ((uVar3 = *(uint *)&pObj->field_0x18 & 7, uVar3 == 4 || (uVar3 - 5 < 2)))) {
        Aig_ManDfsReverse_rec(p,pObj,vNodes);
      }
      lVar4 = lVar4 + 1;
      pVVar6 = p->vObjs;
    } while (lVar4 < pVVar6->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsReverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) )
            Aig_ManDfsReverse_rec( p, pObj, vNodes );
    return vNodes;
}